

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triple.cpp
# Opt level: O2

void __thiscall llvm::Triple::getOSVersion(Triple *this,uint *Major,uint *Minor,uint *Micro)

{
  int iVar1;
  ulong __n;
  StringRef Name;
  StringRef SVar3;
  char *__s1;
  ulong uVar2;
  
  Name = getOSName(this);
  uVar2 = Name.Length;
  __s1 = Name.Data;
  SVar3 = getOSTypeName(this->OS);
  __n = SVar3.Length;
  if ((uVar2 < __n) || ((__n != 0 && (iVar1 = bcmp(__s1,SVar3.Data,__n), iVar1 != 0)))) {
    if ((4 < uVar2 && this->OS == MacOSX) && (iVar1 = bcmp(__s1,"macos",5), iVar1 == 0)) {
      Name.Length = uVar2 - 5;
      Name.Data = __s1 + 5;
    }
  }
  else {
    Name.Length = uVar2 - __n;
    Name.Data = __s1 + __n;
  }
  parseVersionFromName(Name,Major,Minor,Micro);
  return;
}

Assistant:

void Triple::getOSVersion(unsigned &Major, unsigned &Minor,
                          unsigned &Micro) const {
  StringRef OSName = getOSName();
  // Assume that the OS portion of the triple starts with the canonical name.
  StringRef OSTypeName = getOSTypeName(getOS());
  if (OSName.startswith(OSTypeName))
    OSName = OSName.substr(OSTypeName.size());
  else if (getOS() == MacOSX)
    OSName.consume_front("macos");

  parseVersionFromName(OSName, Major, Minor, Micro);
}